

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O3

bool __thiscall SayIntentionsConnection::ProcessFetchedData(SayIntentionsConnection *this)

{
  double dVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  JSON_Array *array;
  size_t sVar7;
  JSON_Object *object;
  unsigned_long _num;
  long lVar8;
  long lVar9;
  mapped_type *this_00;
  char *pcVar10;
  SayIntentionsConnection *this_01;
  char *__s;
  ulong index;
  undefined8 unaff_RBP;
  ulong uVar11;
  bool bVar12;
  unique_lock<std::mutex> mapFdLock;
  FDKeyTy fdKey;
  string acFilter;
  FDDynamicData dyn;
  FDStaticData stat;
  positionTy viewPos;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  pthread_mutex_t *local_3a0;
  double local_398;
  JSON_Value *local_390;
  string local_388;
  uint local_364;
  unique_lock<std::mutex> local_360;
  SayIntentionsConnection *local_350;
  long *local_348;
  size_t local_340;
  long local_338 [2];
  FDKeyTy local_328;
  JSON_Array *local_2f8;
  double local_2f0;
  string *local_2e8;
  positionTy local_2e0;
  string local_298;
  string local_278;
  FDDynamicData local_258;
  undefined1 local_210 [216];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  _Alloc_hider local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined2 local_80;
  positionTy local_78;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    bVar12 = true;
  }
  else {
    if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse == 200) {
      local_390 = json_parse_string((char *)0x19c9cf);
      if (local_390 != (JSON_Value *)0x0) {
        array = json_array(local_390);
        uVar11 = CONCAT71((int7)((ulong)unaff_RBP >> 8),array != (JSON_Array *)0x0);
        if (array == (JSON_Array *)0x0) {
          if ((int)dataRefs.iLogLevel < 4) {
            uVar6 = json_type(local_390);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                   ,0x76,"ProcessFetchedData",logERR,"Expected a JSON Array, but got type %d",
                   (ulong)uVar6);
          }
          (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [8])(this);
        }
        else {
          DataRefs::GetViewPos();
          local_350 = this;
          DataRefs::GetDebugAcFilter_abi_cxx11_(&local_278,&dataRefs);
          local_2e8 = &dataRefs.sSIDisplayName;
          local_364 = (uint)uVar11;
          local_2f8 = array;
          for (index = 0; sVar7 = json_array_get_count(array), index < sVar7; index = index + 1) {
            object = json_array_get_object(array,index);
            if (object != (JSON_Object *)0x0) {
              jog_s(object,"displayname");
              iVar5 = std::__cxx11::string::compare((char *)local_2e8);
              if (iVar5 != 0) {
                dVar1 = json_object_dotget_number(object,"flight_id");
                _num = lround(dVar1);
                LTFlightData::FDKeyTy::FDKeyTy(&local_328,KEY_SAYINTENTIONS,_num);
                if (local_278._M_string_length == 0) {
LAB_0019cb7b:
                  local_398 = jog_n_nan(object,"lat");
                  local_3a0 = (pthread_mutex_t *)jog_n_nan(object,"lon");
                  dVar1 = json_object_dotget_number(object,"altitude");
                  lVar8 = lround(dVar1);
                  local_2f0 = local_350->tsRequest;
                  dVar1 = json_object_dotget_number(object,"heading");
                  lVar9 = lround(dVar1);
                  local_2e0._head = (double)lVar9;
                  local_2e0._alt = (double)lVar8 * 0.3048;
                  local_2e0._lat = local_398;
                  local_2e0._lon = (double)local_3a0;
                  local_2e0._ts = local_2f0;
                  local_2e0._pitch = NAN;
                  local_2e0._roll = NAN;
                  local_2e0.mergeCount = 1;
                  local_2e0._60_4_ = local_2e0._60_4_ & 0xffff8000;
                  local_2e0.edgeIdx = 0xffffffffffffffff;
                  local_398 = CoordDistance(&local_2e0,&local_78);
                  if (local_398 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
                    dVar1 = json_object_dotget_number(object,"altitude_agl");
                    lVar8 = lround(dVar1);
                    if (lVar8 < 1) {
                      local_2e0._60_4_ = local_2e0._60_4_ & 0xfffffcff | 0x200;
                    }
                    local_360._M_device = &mapFdMutex;
                    local_360._M_owns = false;
                    std::unique_lock<std::mutex>::lock(&local_360);
                    local_360._M_owns = true;
                    this_00 = std::
                              map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                              ::operator[](&mapFd,&local_328);
                    local_3a0 = (pthread_mutex_t *)&this_00->dataAccessMutex;
                    iVar5 = pthread_mutex_lock(local_3a0);
                    if (iVar5 != 0) {
                      std::__throw_system_error(iVar5);
                    }
                    std::unique_lock<std::mutex>::unlock(&local_360);
                    if ((this_00->acKey).key._M_string_length == 0) {
                      LTFlightData::SetKey(this_00,&local_328);
                    }
                    local_210._0_8_ = local_210 + 0x10;
                    local_210._8_8_ = (char *)0x0;
                    local_210[0x10] = '\0';
                    local_210._32_8_ = local_210 + 0x30;
                    local_210._40_8_ = 0;
                    local_210[0x30] = '\0';
                    local_210._64_8_ = local_210 + 0x50;
                    local_210._72_8_ = (char *)0x0;
                    local_210[0x50] = '\0';
                    local_210._96_8_ = local_210 + 0x70;
                    local_210._104_8_ = 0;
                    local_210[0x70] = '\0';
                    local_210._128_8_ = local_210 + 0x90;
                    local_210._136_8_ = 0;
                    local_210[0x90] = '\0';
                    local_210._160_8_ = local_210 + 0xb0;
                    local_210._168_8_ = 0;
                    local_210[0xb0] = '\0';
                    local_210._192_4_ = -1;
                    local_210._196_4_ = -1;
                    local_210._200_4_ = 0;
                    local_210[0xcc] = false;
                    local_210._208_8_ = (Doc8643 *)0x0;
                    local_138._M_p = (pointer)&local_128;
                    local_130 = 0;
                    local_128._M_local_buf[0] = '\0';
                    local_108 = (pointer)0x0;
                    local_118 = (pointer)0x0;
                    pbStack_110 = (pointer)0x0;
                    local_100._M_p = (pointer)&local_f0;
                    local_f8 = (char *)0x0;
                    local_f0._M_local_buf[0] = '\0';
                    local_e0._M_p = (pointer)&local_d0;
                    local_d8 = 0;
                    local_d0._M_local_buf[0] = '\0';
                    local_c0._M_p = (pointer)&local_b0;
                    local_b8 = 0;
                    local_b0._M_local_buf[0] = '\0';
                    local_a0._M_p = (pointer)&local_90;
                    local_98 = 0;
                    local_90._M_local_buf[0] = '\0';
                    local_80._0_1_ = false;
                    local_80._1_1_ = false;
                    pcVar10 = jog_s(object,"tail_number");
                    uVar4 = local_210._8_8_;
                    strlen(pcVar10);
                    std::__cxx11::string::_M_replace
                              ((ulong)local_210,0,(char *)uVar4,(ulong)pcVar10);
                    pcVar10 = jog_s(object,"aircraft_icao");
                    uVar4 = local_210._72_8_;
                    strlen(pcVar10);
                    std::__cxx11::string::_M_replace
                              ((ulong)(local_210 + 0x40),0,(char *)uVar4,(ulong)pcVar10);
                    this_01 = (SayIntentionsConnection *)jog_s(object,"callsign");
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_298,(char *)this_01,(allocator<char> *)&local_388);
                    UnprocessCallSign((string *)&local_258,this_01,&local_298);
                    std::__cxx11::string::operator=((string *)&local_138,(string *)&local_258);
                    if ((XPMPTransponderMode *)local_258.radar.size != &local_258.radar.mode) {
                      operator_delete((void *)local_258.radar.size,local_258.radar._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_298._M_dataplus._M_p != &local_298.field_2) {
                      operator_delete(local_298._M_dataplus._M_p,
                                      local_298.field_2._M_allocated_capacity + 1);
                    }
                    pcVar10 = jog_s(object,"origin");
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_258,pcVar10,&local_3a1);
                    pcVar10 = jog_s(object,"final_destination");
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_388,pcVar10,&local_3a2);
                    LTFlightData::FDStaticData::setOrigDest
                              ((FDStaticData *)local_210,(string *)&local_258,&local_388);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_388._M_dataplus._M_p != &local_388.field_2) {
                      operator_delete(local_388._M_dataplus._M_p,
                                      local_388.field_2._M_allocated_capacity + 1);
                    }
                    if ((XPMPTransponderMode *)local_258.radar.size != &local_258.radar.mode) {
                      operator_delete((void *)local_258.radar.size,local_258.radar._16_8_ + 1);
                    }
                    __s = jog_s(object,"displayname");
                    pcVar10 = local_f8;
                    strlen(__s);
                    std::__cxx11::string::_M_replace((ulong)&local_100,0,pcVar10,(ulong)__s);
                    LTFlightData::FDDynamicData::FDDynamicData(&local_258);
                    local_258.gnd = (local_2e0._60_4_ & 0x300) == 0x200;
                    local_258.heading = local_2e0._head;
                    local_258.spd = jog_n_nan(object,"airspeed");
                    local_258.ts = local_2e0._ts;
                    local_258.pChannel = (LTChannel *)local_350;
                    LTFlightData::UpdateData
                              (this_00,(FDStaticData *)local_210,local_398,DATREQU_NONE);
                    bVar12 = positionTy::isNormal(&local_2e0,true);
                    _Var3._M_p = local_328.key._M_dataplus._M_p;
                    if (bVar12) {
                      LTFlightData::AddDynData(this_00,&local_258,0,0,&local_2e0);
                    }
                    else if ((int)dataRefs.iLogLevel < 1) {
                      positionTy::dbgTxt_abi_cxx11_(&local_388,&local_2e0);
                      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
                             ,0xcc,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",
                             _Var3._M_p,local_388._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_388._M_dataplus._M_p != &local_388.field_2) {
                        operator_delete(local_388._M_dataplus._M_p,
                                        local_388.field_2._M_allocated_capacity + 1);
                      }
                    }
                    LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_210);
                    pthread_mutex_unlock(local_3a0);
                    std::unique_lock<std::mutex>::~unique_lock(&local_360);
                  }
                }
                else {
                  local_348 = local_338;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_348,local_278._M_dataplus._M_p,
                             local_278._M_dataplus._M_p + local_278._M_string_length);
                  plVar2 = local_348;
                  if (local_328.key._M_string_length == local_340) {
                    if (local_328.key._M_string_length == 0) {
                      if (local_348 != local_338) {
                        operator_delete(local_348,local_338[0] + 1);
                      }
                      goto LAB_0019cb7b;
                    }
                    iVar5 = bcmp(local_328.key._M_dataplus._M_p,local_348,
                                 local_328.key._M_string_length);
                    bVar12 = iVar5 != 0;
                  }
                  else {
                    bVar12 = true;
                  }
                  if (plVar2 != local_338) {
                    operator_delete(plVar2,local_338[0] + 1);
                  }
                  if (!bVar12) goto LAB_0019cb7b;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328.key._M_dataplus._M_p != &local_328.key.field_2) {
                  operator_delete(local_328.key._M_dataplus._M_p,
                                  local_328.key.field_2._M_allocated_capacity + 1);
                }
                uVar11 = (ulong)local_364;
                array = local_2f8;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
        }
        json_value_free(local_390);
        return (bool)(char)uVar11;
      }
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSayIntentions.cpp"
               ,0x70,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
      }
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool SayIntentionsConnection::ProcessFetchedData ()
{
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // Only proceed in case HTTP response was OK
    if (httpResponse != HTTP_OK) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // The entire JSON is an array of objects
    const JSON_Array* pArrAc = json_array(pRoot.get());
    if (!pArrAc) {
        LOG_MSG(logERR, "Expected a JSON Array, but got type %d",
                (int)json_type(pRoot.get()));
        IncErrCnt();
        return false;
    }
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );

    // Process all flights
    for (size_t i = 0; i < json_array_get_count(pArrAc); ++i)
    {
        const JSON_Object* pAc = json_array_get_object(pArrAc, i);
        if (!pAc) continue;
        
        // Displayname is matching? My own flight! -> Skip it
        if (jog_s(pAc, SI_DISPLAYNAME) == dataRefs.GetSIDisplayName())
            continue;

        // Key is the SayIntentions flight_id
        LTFlightData::FDKeyTy fdKey (LTFlightData::KEY_SAYINTENTIONS,
                                     (unsigned long)jog_l(pAc, SI_KEY));
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;
        
        // Position
        positionTy pos (jog_n_nan(pAc, SI_LAT),
                        jog_n_nan(pAc, SI_LON),
                        jog_l(pAc, SI_ALT) * M_per_FT,
                        tsRequest,
                        jog_l(pAc, SI_HEADING));
        
        // SI returns all world's traffic, we restrict to what's within defined limits
        const double dist = pos.dist(viewPos);
        if (dist > dataRefs.GetFdStdDistance_m() )
            continue;
        
        // On ground?
        if (jog_l(pAc, SI_ALT_AGL) <= 0)
            pos.f.onGrnd = GND_ON;

        // from here on access to fdMap guarded by a mutex
        // until FD object is inserted and updated
        std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

        // get the fd object from the map, key is the flight_id,
        // this fetches an existing or, if not existing, creates a new one
        LTFlightData& fd = mapFd[fdKey];

        // also get the data access lock once and for all
        // so following fetch/update calls only make quick recursive calls
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        // now that we have the detail lock we can release the global one
        mapFdLock.unlock();

        // completely new? fill key fields
        if ( fd.empty() )
            fd.SetKey(fdKey);
        
        // -- fill static data --
        LTFlightData::FDStaticData stat;
        stat.reg            = jog_s(pAc, SI_REG);
        stat.acTypeIcao     = jog_s(pAc, SI_AC_TYPE);
        stat.call           = UnprocessCallSign(jog_s(pAc, SI_CALL));
        stat.setOrigDest(jog_s(pAc, SI_ORIGIN),
                         jog_s(pAc, SI_DEST));
        stat.flight         = jog_s(pAc, SI_DISPLAYNAME);
        
        // -- dynamic data --
        LTFlightData::FDDynamicData dyn;
        dyn.gnd             = pos.IsOnGnd();
        dyn.heading         = pos.heading();
        dyn.spd             = jog_n_nan(pAc, SI_SPD);
        dyn.ts              = pos.ts();
        dyn.pChannel        = this;
        
        // update the a/c's master data
        fd.UpdateData(std::move(stat), dist);
        
        // position is rather important, we check for validity
        if ( pos.isNormal(true) ) {
            fd.AddDynData(dyn, 0, 0, &pos);
        }
        else
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
    }
    
    // all good
    return true;
}